

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistwidget.cpp
# Opt level: O0

QListWidgetItem * __thiscall QListModel::take(QListModel *this,int row)

{
  QList<QListWidgetItem_*> *this_00;
  qsizetype qVar1;
  const_reference ppQVar2;
  int in_ESI;
  QModelIndex *in_RDI;
  long in_FS_OFFSET;
  QListWidgetItem *item;
  qsizetype in_stack_ffffffffffffffa8;
  QList<QListWidgetItem_*> *in_stack_ffffffffffffffc0;
  QListWidgetItem *local_28;
  undefined1 local_20 [24];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (-1 < in_ESI) {
    this_00 = (QList<QListWidgetItem_*> *)(long)in_ESI;
    qVar1 = QList<QListWidgetItem_*>::size((QList<QListWidgetItem_*> *)(in_RDI + 0x10));
    if ((long)this_00 < qVar1) {
      QModelIndex::QModelIndex((QModelIndex *)0x899fcd);
      QAbstractItemModel::beginRemoveRows(in_RDI,(int)local_20,in_ESI);
      ppQVar2 = QList<QListWidgetItem_*>::at(this_00,in_stack_ffffffffffffffa8);
      (*ppQVar2)->d->theid = -1;
      ppQVar2 = QList<QListWidgetItem_*>::at(this_00,in_stack_ffffffffffffffa8);
      (*ppQVar2)->view = (QListWidget *)0x0;
      local_28 = QList<QListWidgetItem_*>::takeAt(in_stack_ffffffffffffffc0,(qsizetype)in_RDI);
      QAbstractItemModel::endRemoveRows();
      goto LAB_0089a04f;
    }
  }
  local_28 = (QListWidgetItem *)0x0;
LAB_0089a04f:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_28;
  }
  __stack_chk_fail();
}

Assistant:

QListWidgetItem *QListModel::take(int row)
{
    if (row < 0 || row >= items.size())
        return nullptr;

    beginRemoveRows(QModelIndex(), row, row);
    items.at(row)->d->theid = -1;
    items.at(row)->view = nullptr;
    QListWidgetItem *item = items.takeAt(row);
    endRemoveRows();
    return item;
}